

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid,REF_INT node,REF_INT *node0,REF_INT *node1)

{
  int iVar1;
  int iVar2;
  REF_CELL pRVar3;
  REF_ADJ pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  REF_ADJ_ITEM pRVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  REF_INT *pRVar13;
  bool bVar14;
  
  pRVar3 = ref_grid->cell[0];
  *node0 = -1;
  *node1 = -1;
  if (((-1 < node) && (pRVar4 = pRVar3->ref_adj, node < pRVar4->nnode)) &&
     (lVar10 = (long)pRVar4->first[(uint)node], lVar10 != -1)) {
    pRVar7 = pRVar4->item + lVar10;
    uVar9 = (ulong)(uint)pRVar3->edge_per;
    while( true ) {
      if (0 < (int)uVar9) {
        iVar1 = pRVar7->ref;
        pRVar5 = pRVar3->e2n;
        pRVar6 = pRVar3->c2n;
        lVar11 = 0;
        do {
          lVar12 = (long)pRVar3->size_per * (long)iVar1;
          iVar2 = pRVar6[pRVar5[lVar11 * 2] + lVar12];
          iVar8 = pRVar6[(long)(int)lVar12 + (long)pRVar5[lVar11 * 2 + 1]];
          if ((iVar2 == node) || (bVar14 = iVar8 == node, iVar8 = iVar2, bVar14)) {
            pRVar13 = node0;
            if ((*node0 != -1) && (pRVar13 = node1, *node1 != -1)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x2c7,"ref_smooth_edge_neighbors","found more than two boundary edges",pRVar5,
                     0);
              return 1;
            }
            *pRVar13 = iVar8;
          }
          lVar11 = lVar11 + 1;
          uVar9 = (ulong)pRVar3->edge_per;
        } while (lVar11 < (long)uVar9);
      }
      pRVar7 = pRVar3->ref_adj->item;
      lVar10 = (long)pRVar7[(int)lVar10].next;
      if (lVar10 == -1) break;
      pRVar7 = pRVar7 + lVar10;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid, REF_INT node,
                                             REF_INT *node0, REF_INT *node1) {
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item, cell, cell_edge, other;

  *node0 = REF_EMPTY;
  *node1 = REF_EMPTY;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      if (node == ref_cell_e2n(ref_cell, 0, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      } else if (node == ref_cell_e2n(ref_cell, 1, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      } else {
        continue;
      }
      if (REF_EMPTY == *node0) {
        *node0 = other;
        continue;
      }
      if (REF_EMPTY == *node1) {
        *node1 = other;
        continue;
      }
      THROW("found more than two boundary edges");
    }
  }

  return REF_SUCCESS;
}